

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_format(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *s;
  size_t l;
  lua_Number n_1;
  lua_Integer n;
  char *pcStack_2080;
  int nb;
  char *buff;
  char form [32];
  luaL_Buffer b;
  char *strfrmt_end;
  char *strfrmt;
  size_t sfl;
  int arg;
  int top;
  lua_State *L_local;
  
  _arg = L;
  sfl._4_4_ = lua_gettop(L);
  sfl._0_4_ = 1;
  pcVar2 = luaL_checklstring(_arg,1,(size_t *)&strfrmt);
  luaL_buffinit(_arg,(luaL_Buffer *)(form + 0x18));
  strfrmt_end = pcVar2;
  while (strfrmt_end < pcVar2 + (long)strfrmt) {
    if (*strfrmt_end == '%') {
      pcVar6 = strfrmt_end + 1;
      if (strfrmt_end[1] == '%') {
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),1);
        }
        strfrmt_end = strfrmt_end + 2;
        *(char *)(form._24_8_ + b.size) = *pcVar6;
        b.size = b.size + 1;
      }
      else {
        pcStack_2080 = luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),0x1ac);
        n._4_4_ = 0;
        sfl._0_4_ = (int)sfl + 1;
        if (sfl._4_4_ < (int)sfl) {
          luaL_argerror(_arg,(int)sfl,"no value");
        }
        pcVar3 = scanformat(_arg,pcVar6,(char *)&buff);
        pcVar6 = pcStack_2080;
        strfrmt_end = pcVar3 + 1;
        switch(*pcVar3) {
        case 'A':
        case 'a':
          addlenmod((char *)&buff,"");
          pcVar6 = pcStack_2080;
          luaL_checknumber(_arg,(int)sfl);
          n._4_4_ = snprintf(pcVar6,0x1ac,(char *)&buff);
          break;
        default:
          iVar1 = luaL_error(_arg,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)*pcVar3)
          ;
          return iVar1;
        case 'E':
        case 'G':
        case 'e':
        case 'f':
        case 'g':
          l = (size_t)luaL_checknumber(_arg,(int)sfl);
          addlenmod((char *)&buff,"");
          n._4_4_ = snprintf(pcStack_2080,0x1ac,(char *)&buff,l);
          break;
        case 'X':
        case 'd':
        case 'i':
        case 'o':
        case 'u':
        case 'x':
          n_1 = (lua_Number)luaL_checkinteger(_arg,(int)sfl);
          addlenmod((char *)&buff,"ll");
          n._4_4_ = snprintf(pcStack_2080,0x1ac,(char *)&buff,n_1);
          break;
        case 'c':
          uVar4 = luaL_checkinteger(_arg,(int)sfl);
          n._4_4_ = snprintf(pcVar6,0x1ac,(char *)&buff,uVar4 & 0xffffffff);
          break;
        case 'q':
          addliteral(_arg,(luaL_Buffer *)(form + 0x18),(int)sfl);
          break;
        case 's':
          pcVar3 = luaL_tolstring(_arg,(int)sfl,(size_t *)&s);
          pcVar6 = s;
          if (buff._2_1_ == '\0') {
            luaL_addvalue((luaL_Buffer *)(form + 0x18));
          }
          else {
            pcVar5 = (char *)strlen(pcVar3);
            if (pcVar6 != pcVar5) {
              luaL_argerror(_arg,(int)sfl,"string contains zeros");
            }
            pcVar6 = strchr((char *)&buff,0x2e);
            if ((pcVar6 == (char *)0x0) && ((char *)0x63 < s)) {
              luaL_addvalue((luaL_Buffer *)(form + 0x18));
            }
            else {
              n._4_4_ = snprintf(pcStack_2080,0x1ac,(char *)&buff,pcVar3);
              lua_settop(_arg,-2);
            }
          }
        }
        b.size = (long)n._4_4_ + b.size;
      }
    }
    else {
      if (b.b <= b.size) {
        luaL_prepbuffsize((luaL_Buffer *)(form + 0x18),1);
      }
      *(char *)(form._24_8_ + b.size) = *strfrmt_end;
      b.size = b.size + 1;
      strfrmt_end = strfrmt_end + 1;
    }
  }
  luaL_pushresult((luaL_Buffer *)(form + 0x18));
  return 1;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      char *buff = luaL_prepbuffsize(&b, MAX_ITEM);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, MAX_ITEM, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, MAX_ITEM, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, MAX_ITEM, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'e': case 'E': case 'f':
        case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, MAX_ITEM, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'q': {
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, MAX_ITEM, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid option '%%%c' to 'format'",
                               *(strfrmt - 1));
        }
      }
      lua_assert(nb < MAX_ITEM);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}